

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

void __thiscall ThreadPool::WorkOrWait(ThreadPool *this,unique_lock<std::mutex> *lock)

{
  ParallelJob *this_00;
  bool bVar1;
  int iVar2;
  ThreadPool *pTVar3;
  
  pTVar3 = this;
  while( true ) {
    this_00 = pTVar3->jobList;
    if (this_00 == (ParallelJob *)0x0) {
      std::condition_variable::wait((unique_lock *)&this->jobListCondition);
      return;
    }
    iVar2 = (*this_00->_vptr_ParallelJob[3])(this_00);
    if ((char)iVar2 != '\0') break;
    pTVar3 = (ThreadPool *)&this_00->next;
  }
  this_00->activeWorkers = this_00->activeWorkers + 1;
  (*this_00->_vptr_ParallelJob[2])(this_00,lock);
  std::unique_lock<std::mutex>::lock(lock);
  this_00->activeWorkers = this_00->activeWorkers + -1;
  bVar1 = ParallelJob::Finished(this_00);
  if (bVar1) {
    std::condition_variable::notify_all();
    return;
  }
  return;
}

Assistant:

void ThreadPool::WorkOrWait(std::unique_lock<std::mutex> *lock) {
    assert(lock->owns_lock());

    ParallelJob *job = jobList;
    while ((job != nullptr) && !job->HaveWork())
        job = job->next;
    if (job != nullptr) {
        // Run a chunk of loop iterations for _loop_
        job->activeWorkers++;

        job->RunStep(lock);

        assert(!lock->owns_lock());
        lock->lock();

        // Update _loop_ to reflect completion of iterations
        job->activeWorkers--;

        if (job->Finished())
            jobListCondition.notify_all();
    } else
        // Wait for something to change (new work, or this loop being
        // finished).
        jobListCondition.wait(*lock);
}